

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall
luna::Exception::SetWhat<char_const*&,char,char_const*,char_const(&)[7],char_const*>
          (Exception *this,ostringstream *oss,char **arg,char *args,char **args_1,char (*args_2) [7]
          ,char **args_3)

{
  std::operator<<((ostream *)oss,*arg);
  SetWhat<char,char_const*,char_const(&)[7],char_const*>(this,oss,args,args_1,args_2,args_3);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }